

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightBounds> * __thiscall
pbrt::PointLight::Bounds(optional<pbrt::LightBounds> *__return_storage_ptr__,PointLight *this)

{
  float fVar1;
  undefined8 uVar2;
  Float FVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Point3<float> PVar7;
  Vector3<float> VVar8;
  Tuple3<pbrt::Vector3,_float> local_78;
  Tuple3<pbrt::Point3,_float> local_68;
  undefined1 local_58 [32];
  Bounds3<float> local_38;
  
  auVar6 = in_ZMM0._8_56_;
  local_58._0_4_ = 0.0;
  local_58._4_4_ = 0.0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
  PVar7 = Transform::operator()(&(this->super_LightBase).renderFromLight,(Point3<float> *)local_58);
  local_68.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  local_68._0_8_ = vmovlps_avx(auVar4._0_16_);
  fVar1 = this->scale;
  FVar3 = DenselySampledSpectrum::MaxValue(&this->I);
  Bounds3<float>::Bounds3(&local_38,(Point3<float> *)&local_68,(Point3<float> *)&local_68);
  auVar6 = ZEXT856((ulong)local_38._8_8_);
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_78.z = 1.0;
  local_58._16_4_ = local_38.pMax.super_Tuple3<pbrt::Point3,_float>.y;
  local_58._20_4_ = local_38.pMax.super_Tuple3<pbrt::Point3,_float>.z;
  local_58._0_4_ = local_38.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  local_58._4_4_ = local_38.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  local_58._8_4_ = local_38.pMin.super_Tuple3<pbrt::Point3,_float>.z;
  local_58._12_4_ = local_38.pMax.super_Tuple3<pbrt::Point3,_float>.x;
  VVar8 = Normalize<float>((Vector3<float> *)&local_78);
  auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  __return_storage_ptr__->set = true;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_58._16_8_;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = local_58._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_58._8_8_;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar3 * fVar1 * 12.566371;
  uVar2 = vmovlps_avx(auVar5._0_16_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) =
       VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0xb33bbd2ebf800000;
  (__return_storage_ptr__->optionalValue).__data[0x30] = '\0';
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightBounds> PointLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Float phi = 4 * Pi * scale * I.MaxValue();
    return LightBounds(Bounds3f(p, p), Vector3f(0, 0, 1), phi, std::cos(Pi),
                       std::cos(Pi / 2), false);
}